

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_copy_constructor_equals_self_Test::TestBody
          (ByteBufferTest_test_copy_constructor_equals_self_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f8;
  Message local_f0;
  uchar local_e5;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  unsigned_long local_c0;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  ByteBuffer b;
  ByteBuffer local_40 [8];
  ByteBuffer a;
  ByteBufferTest_test_copy_constructor_equals_self_Test *this_local;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_40,5);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_40);
  bidfx_public_api::tools::ByteBuffer::ReadByte();
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar.message_,local_40);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::tools::ByteBuffer,bidfx_public_api::tools::ByteBuffer>
            ((EqHelper<false> *)local_90,"a","b",local_40,(ByteBuffer *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_b4 = 3;
  local_c0 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_b0,"3","b.ReadableBytes()",&local_b4,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e4 = 7;
  local_e5 = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_e0,"7","b.ReadByte()",&local_e4,&local_e5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xe0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(ByteBufferTest, test_copy_constructor_equals_self)
{
    ByteBuffer a(5);
    a.WriteByte(5);
    a.WriteByte(7);
    a.WriteByte(9);
    a.WriteByte(11);
    a.ReadByte(); //Shift the read index away from 0
    ByteBuffer b(a);
    EXPECT_EQ(a, b);
    EXPECT_EQ(3, b.ReadableBytes());
    EXPECT_EQ(7, b.ReadByte());
}